

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

int anon_unknown.dwarf_a40::GetPulseLocationsForTimeBase
              (double *interpolated_f0,double *time_axis,int y_length,int fs,double *pulse_locations
              ,int *pulse_locations_index,double *pulse_locations_time_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  void *pvVar7;
  double dVar8;
  double x;
  double y2;
  double y1;
  int local_50;
  int i_1;
  int number_of_pulses;
  int i;
  double *wrap_phase_abs;
  double *wrap_phase;
  double *total_phase;
  int *pulse_locations_index_local;
  double *pulse_locations_local;
  int fs_local;
  int y_length_local;
  double *time_axis_local;
  double *interpolated_f0_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)y_length;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)y_length;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(y_length + -1);
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar4);
  *pdVar5 = (*interpolated_f0 * 6.283185307179586) / (double)fs;
  dVar8 = fmod(*pdVar5,6.283185307179586);
  *pdVar6 = dVar8;
  for (i_1 = 1; i_1 < y_length; i_1 = i_1 + 1) {
    pdVar5[i_1] = pdVar5[i_1 + -1] + (interpolated_f0[i_1] * 6.283185307179586) / (double)fs;
    dVar8 = fmod(pdVar5[i_1],6.283185307179586);
    pdVar6[i_1] = dVar8;
    *(double *)((long)pvVar7 + (long)(i_1 + -1) * 8) = ABS(pdVar6[i_1] - pdVar6[i_1 + -1]);
  }
  local_50 = 0;
  for (y1._4_4_ = 0; y1._4_4_ < y_length + -1; y1._4_4_ = y1._4_4_ + 1) {
    if (3.141592653589793 < *(double *)((long)pvVar7 + (long)y1._4_4_ * 8)) {
      pulse_locations[local_50] = time_axis[y1._4_4_];
      pulse_locations_index[local_50] = y1._4_4_;
      pulse_locations_time_shift[local_50] =
           (-(pdVar6[y1._4_4_] - 6.283185307179586) /
           (pdVar6[y1._4_4_ + 1] - (pdVar6[y1._4_4_] - 6.283185307179586))) / (double)fs;
      local_50 = local_50 + 1;
    }
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  if (pdVar6 != (double *)0x0) {
    operator_delete__(pdVar6);
  }
  if (pdVar5 != (double *)0x0) {
    operator_delete__(pdVar5);
  }
  return local_50;
}

Assistant:

static int GetPulseLocationsForTimeBase(const double *interpolated_f0,
    const double *time_axis, int y_length, int fs, double *pulse_locations,
    int *pulse_locations_index, double *pulse_locations_time_shift) {
  double *total_phase = new double[y_length];
  double *wrap_phase = new double[y_length];
  double *wrap_phase_abs = new double[y_length - 1];
  total_phase[0] = 2.0 * world::kPi * interpolated_f0[0] / fs;
  wrap_phase[0] = fmod(total_phase[0], 2.0 * world::kPi);
  for (int i = 1; i < y_length; ++i) {
    total_phase[i] = total_phase[i - 1] +
      2.0 * world::kPi * interpolated_f0[i] / fs;
    wrap_phase[i] = fmod(total_phase[i], 2.0 * world::kPi);
    wrap_phase_abs[i - 1] = fabs(wrap_phase[i] - wrap_phase[i - 1]);
  }

  int number_of_pulses = 0;
  for (int i = 0; i < y_length - 1; ++i) {
    if (wrap_phase_abs[i] > world::kPi) {
      pulse_locations[number_of_pulses] = time_axis[i];
      pulse_locations_index[number_of_pulses] = i;

      // calculate the time shift in seconds between exact fractional pulse
      // position and the integer pulse position (sample i)
      // as we don't have access to the exact pulse position, we infer it
      // from the point between sample i and sample i + 1 where the
      // accummulated phase cross a multiple of 2pi
      // this point is found by solving y1 + x * (y2 - y1) = 0 for x, where y1
      // and y2 are the phases corresponding to sample i and i + 1, offset so
      // they cross zero; x >= 0
      double y1 = wrap_phase[i] - 2.0 * world::kPi;
      double y2 = wrap_phase[i + 1];
      double x = -y1 / (y2 - y1);
      pulse_locations_time_shift[number_of_pulses] = x / fs;

      ++number_of_pulses;
    }
  }

  delete[] wrap_phase_abs;
  delete[] wrap_phase;
  delete[] total_phase;

  return number_of_pulses;
}